

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CodeVerifyNamedSchema(Parse *pParse,char *zDb)

{
  byte bVar1;
  byte bVar2;
  sqlite3 *psVar3;
  long lVar4;
  long lVar5;
  
  psVar3 = pParse->db;
  if (psVar3->nDb < 1) {
    return;
  }
  lVar5 = 0;
LAB_001890f8:
  if (psVar3->aDb[lVar5].pBt != (Btree *)0x0) {
    if (zDb != (char *)0x0) {
      lVar4 = 0;
      do {
        bVar1 = zDb[lVar4];
        bVar2 = psVar3->aDb[lVar5].zDbSName[lVar4];
        if (bVar1 == bVar2) {
          if ((ulong)bVar1 == 0) goto LAB_0018913c;
        }
        else if (""[bVar1] != ""[bVar2]) goto LAB_0018913c;
        lVar4 = lVar4 + 1;
      } while( true );
    }
    goto LAB_00189141;
  }
  goto LAB_0018914c;
LAB_0018913c:
  if (bVar1 == bVar2) {
LAB_00189141:
    sqlite3CodeVerifySchema(pParse,(int)lVar5);
  }
LAB_0018914c:
  lVar5 = lVar5 + 1;
  if (psVar3->nDb <= lVar5) {
    return;
  }
  goto LAB_001890f8;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeVerifyNamedSchema(Parse *pParse, const char *zDb){
  sqlite3 *db = pParse->db;
  int i;
  for(i=0; i<db->nDb; i++){
    Db *pDb = &db->aDb[i];
    if( pDb->pBt && (!zDb || 0==sqlite3StrICmp(zDb, pDb->zDbSName)) ){
      sqlite3CodeVerifySchema(pParse, i);
    }
  }
}